

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall
QCborStreamReaderPrivate::QCborStreamReaderPrivate(QCborStreamReaderPrivate *this,QByteArray *data)

{
  undefined8 *in_RDI;
  QByteArray *in_stack_ffffffffffffffd0;
  QCborStreamReaderPrivate *this_00;
  
  *in_RDI = 0;
  QByteArray::QByteArray(in_stack_ffffffffffffffd0,(QByteArray *)(in_RDI + 1));
  this_00 = (QCborStreamReaderPrivate *)(in_RDI + 4);
  QStack<CborValue>::QStack((QStack<CborValue> *)0x8d95c8);
  *(undefined4 *)(in_RDI + 0xc) = 0;
  in_RDI[0xd] = 0;
  *(undefined1 *)(in_RDI + 0xe) = 0;
  initDecoder(this_00);
  return;
}

Assistant:

QCborStreamReaderPrivate(const QByteArray &data)
        : device(nullptr), buffer(data)
    {
        initDecoder();
    }